

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void INT_REVset_attr_list(CMConnection conn,EVstone stone_id,attr_list list)

{
  int iVar1;
  CMFormat p_Var2;
  CMConnection conn_00;
  undefined8 in_RDX;
  int in_ESI;
  CManager in_RDI;
  EVset_attr_list_request request;
  CMFormat f;
  int cond;
  CMConnection in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  int condition;
  
  memset(&stack0xffffffffffffffc8,0,0x10);
  iVar1 = INT_CMCondition_get((CManager)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffd8);
  p_Var2 = INT_CMlookup_format((CManager)in_RDI->transports,EVset_attr_list_req_formats);
  condition = in_ESI;
  conn_00 = (CMConnection)attr_list_to_string(in_RDX);
  iVar3 = iVar1;
  if (p_Var2 == (CMFormat)0x0) {
    p_Var2 = INT_CMregister_format((CManager)0x0,(FMStructDescList)conn_00);
  }
  INT_CMCondition_set_client_data
            ((CManager)CONCAT44(iVar3,in_stack_ffffffffffffffe0),(int)((ulong)p_Var2 >> 0x20),
             conn_00);
  INT_CMwrite(conn_00,(CMFormat)CONCAT44(in_ESI,iVar1),(void *)0x156366);
  free(conn_00);
  INT_CMCondition_wait(in_RDI,condition);
  return;
}

Assistant:

extern void
INT_REVset_attr_list(CMConnection conn, EVstone stone_id, attr_list list)
{
    int cond;
    CMFormat f;
    EVset_attr_list_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVset_attr_list_req_formats);
    request.stone_id = stone_id;
    request.list = attr_list_to_string(list);
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVset_attr_list_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    free(request.list);
    INT_CMCondition_wait(conn->cm, cond);
}